

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall wasm::Asyncify::run(Asyncify *this,Module *module)

{
  __node_base_ptr *canImportChangeState_00;
  bool bVar1;
  int iVar2;
  PassOptions *pPVar3;
  ulong uVar4;
  size_type sVar5;
  reference this_00;
  pointer pMVar6;
  pointer pEVar7;
  Name *pNVar8;
  Memory *this_01;
  pointer func_00;
  pair<std::__detail::_Node_iterator<wasm::Function_*,_true,_false>,_bool> pVar9;
  bool local_14d1;
  bool local_13ba;
  Type local_1390;
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyLocals,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyLocals>_>
  local_1388;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_1380;
  undefined1 local_1378 [8];
  FilteredPassRunner runner_2;
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented>_>
  local_1278;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_1270;
  undefined1 local_1268 [8];
  PassRunner runner_1;
  unique_ptr<wasm::(anonymous_namespace)::AsyncifyFlow,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyFlow>_>
  local_1170;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_1168 [2];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1158;
  allocator<char> local_1129;
  string local_1128;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1100;
  allocator<char> local_10d1;
  string local_10d0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_10a8;
  allocator<char> local_1079;
  string local_1078;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1050;
  allocator<char> local_1021;
  string local_1020;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ff8;
  allocator<char> local_fc9;
  string local_fc8;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_fa0;
  allocator<char> local_f71;
  string local_f70;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f48;
  allocator<char> local_f19;
  string local_f18;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_ef0;
  allocator<char> local_ec1;
  string local_ec0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e98;
  allocator<char> local_e69;
  string local_e68;
  undefined1 local_e48 [8];
  FilteredPassRunner runner;
  pointer local_d40;
  reference local_d38;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2;
  FuncSet instrumentedFuncs;
  undefined1 local_cc0 [8];
  ModuleAnalyzer analyzer;
  anon_class_16_2_6eb1be3e canImportChangeState;
  Split local_a68;
  Split local_a48;
  Split local_a28;
  Split local_a08;
  Split local_9e8;
  Split local_9c8;
  size_t local_9a8;
  char *pcStack_9a0;
  Type local_990;
  Fatal local_988;
  IString local_800;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *local_7f0;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *theExport;
  iterator __end4;
  iterator __begin4;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range4;
  string local_7c8;
  allocator<char> local_7a1;
  string local_7a0;
  undefined1 local_780 [8];
  string asyncifyMemoryValue;
  string_view local_758;
  Address local_748;
  Address secondaryMemorySize;
  string local_738;
  allocator<char> local_711;
  string local_710;
  undefined1 local_6f0 [8];
  string secondaryMemorySizeString;
  string local_6c8;
  byte local_6a2;
  allocator<char> local_6a1;
  undefined1 local_6a0 [6];
  bool propagateAddList;
  byte local_67a;
  allocator<char> local_679;
  undefined1 local_678 [6];
  bool secondaryMemory;
  byte local_652;
  allocator<char> local_651;
  undefined1 local_650 [6];
  bool relocatable;
  byte local_62a;
  allocator<char> local_629;
  undefined1 local_628 [6];
  bool verbose;
  byte local_602;
  allocator<char> local_601;
  undefined1 local_600 [6];
  bool asserts;
  NewLineOr local_5e0;
  string local_5c0;
  string local_5a0;
  undefined1 local_580 [8];
  Split onlyList;
  string local_558;
  allocator<char> local_531;
  string local_530;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  undefined1 local_4a0 [8];
  string onlyListInput;
  string local_478;
  NewLineOr local_458;
  allocator<char> local_431;
  string local_430;
  allocator<char> local_409;
  string local_408;
  string local_3e8;
  string local_3c8;
  string local_3a8;
  undefined1 local_388 [8];
  Split addList;
  string local_360;
  NewLineOr local_340;
  string local_320;
  string local_300;
  undefined1 local_2e0 [8];
  Split removeList;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  undefined1 local_200 [8];
  string removeListInput;
  string local_1d8;
  byte local_1b2;
  allocator<char> local_1b1;
  undefined1 local_1b0 [6];
  bool canIndirectChangeState;
  NewLineOr local_190;
  undefined1 local_170 [8];
  Split listedImports;
  undefined1 local_148 [6];
  bool allImportsCanChangeState;
  allocator<char> local_121;
  string local_120;
  undefined1 local_100 [8];
  string ignoreImports;
  string local_d8;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  undefined1 local_40 [8];
  string stateChangingImports;
  bool optimize;
  Module *module_local;
  Asyncify *this_local;
  
  pPVar3 = Pass::getPassOptions(&this->super_Pass);
  stateChangingImports.field_2._M_local_buf[0xf] = 0 < pPVar3->optimizeLevel;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"asyncify-imports",&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"",(allocator<char> *)(ignoreImports.field_2._M_local_buf + 0xf));
  Pass::getArgumentOrDefault(&local_80,&this->super_Pass,&local_a0,&local_d8);
  read_possible_response_file(&local_60,&local_80);
  String::trim((string *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)(ignoreImports.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"asyncify-ignore-imports",&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_148,"",(allocator<char> *)&listedImports.field_0x1f);
  Pass::getArgumentOrDefault((string *)local_100,&this->super_Pass,&local_120,(string *)local_148);
  std::__cxx11::string::~string((string *)local_148);
  std::allocator<char>::~allocator((allocator<char> *)&listedImports.field_0x1f);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_40,"");
  local_13ba = false;
  if (bVar1) {
    local_13ba = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_100,"");
  }
  listedImports._30_1_ = local_13ba;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1b0,",",&local_1b1);
  String::Split::NewLineOr::NewLineOr(&local_190,(string *)local_1b0);
  String::Split::Split((Split *)local_170,(string *)local_40,&local_190);
  String::Split::NewLineOr::~NewLineOr(&local_190);
  std::__cxx11::string::~string((string *)local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"asyncify-ignore-indirect",
             (allocator<char> *)(removeListInput.field_2._M_local_buf + 0xf));
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)(removeListInput.field_2._M_local_buf + 0xf));
  local_1b2 = ~bVar1 & 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"asyncify-removelist",&local_221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"",&local_249);
  Pass::getArgumentOrDefault((string *)local_200,&this->super_Pass,&local_220,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  std::allocator<char>::~allocator(&local_249);
  std::__cxx11::string::~string((string *)&local_220);
  std::allocator<char>::~allocator(&local_221);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,"asyncify-blacklist",&local_291);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2b8,"",(allocator<char> *)&removeList.field_0x1f);
    Pass::getArgumentOrDefault(&local_270,&this->super_Pass,&local_290,&local_2b8);
    std::__cxx11::string::operator=((string *)local_200,(string *)&local_270);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::allocator<char>::~allocator((allocator<char> *)&removeList.field_0x1f);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
  }
  read_possible_response_file(&local_320,(string *)local_200);
  String::trim(&local_300,&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_360,",",(allocator<char> *)&addList.field_0x1f);
  String::Split::NewLineOr::NewLineOr(&local_340,&local_360);
  String::Split::Split((Split *)local_2e0,&local_300,&local_340);
  String::Split::NewLineOr::~NewLineOr(&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&addList.field_0x1f);
  std::__cxx11::string::~string((string *)&local_300);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_408,"asyncify-addlist",&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_430,"",&local_431);
  Pass::getArgumentOrDefault(&local_3e8,&this->super_Pass,&local_408,&local_430);
  read_possible_response_file(&local_3c8,&local_3e8);
  String::trim(&local_3a8,&local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,",",(allocator<char> *)(onlyListInput.field_2._M_local_buf + 0xf))
  ;
  String::Split::NewLineOr::NewLineOr(&local_458,&local_478);
  String::Split::Split((Split *)local_388,&local_3a8,&local_458);
  String::Split::NewLineOr::~NewLineOr(&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::allocator<char>::~allocator((allocator<char> *)(onlyListInput.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::__cxx11::string::~string((string *)&local_430);
  std::allocator<char>::~allocator(&local_431);
  std::__cxx11::string::~string((string *)&local_408);
  std::allocator<char>::~allocator(&local_409);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4c0,"asyncify-onlylist",&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e8,"",&local_4e9);
  Pass::getArgumentOrDefault((string *)local_4a0,&this->super_Pass,&local_4c0,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_530,"asyncify-whitelist",&local_531);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"",(allocator<char> *)&onlyList.field_0x1f);
    Pass::getArgumentOrDefault(&local_510,&this->super_Pass,&local_530,&local_558);
    std::__cxx11::string::operator=((string *)local_4a0,(string *)&local_510);
    std::__cxx11::string::~string((string *)&local_510);
    std::__cxx11::string::~string((string *)&local_558);
    std::allocator<char>::~allocator((allocator<char> *)&onlyList.field_0x1f);
    std::__cxx11::string::~string((string *)&local_530);
    std::allocator<char>::~allocator(&local_531);
  }
  read_possible_response_file(&local_5c0,(string *)local_4a0);
  String::trim(&local_5a0,&local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_600,",",&local_601);
  String::Split::NewLineOr::NewLineOr(&local_5e0,(string *)local_600);
  String::Split::Split((Split *)local_580,&local_5a0,&local_5e0);
  String::Split::NewLineOr::~NewLineOr(&local_5e0);
  std::__cxx11::string::~string((string *)local_600);
  std::allocator<char>::~allocator(&local_601);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_628,"asyncify-asserts",&local_629);
  bVar1 = Pass::hasArgument(&this->super_Pass,(string *)local_628);
  std::__cxx11::string::~string((string *)local_628);
  std::allocator<char>::~allocator(&local_629);
  local_602 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_650,"asyncify-verbose",&local_651);
  bVar1 = Pass::hasArgument(&this->super_Pass,(string *)local_650);
  std::__cxx11::string::~string((string *)local_650);
  std::allocator<char>::~allocator(&local_651);
  local_62a = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_678,"asyncify-relocatable",&local_679);
  bVar1 = Pass::hasArgument(&this->super_Pass,(string *)local_678);
  std::__cxx11::string::~string((string *)local_678);
  std::allocator<char>::~allocator(&local_679);
  local_652 = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_6a0,"asyncify-in-secondary-memory",&local_6a1);
  bVar1 = Pass::hasArgument(&this->super_Pass,(string *)local_6a0);
  std::__cxx11::string::~string((string *)local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  local_67a = bVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"asyncify-propagate-addlist",
             (allocator<char> *)(secondaryMemorySizeString.field_2._M_local_buf + 0xf));
  bVar1 = Pass::hasArgument(&this->super_Pass,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)(secondaryMemorySizeString.field_2._M_local_buf + 0xf));
  local_6a2 = bVar1;
  if ((local_67a & 1) == 0) {
    sVar5 = std::
            vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
            ::size(&module->memories);
    if (sVar5 < 2) {
      MemoryUtils::ensureExists(module);
      this_00 = std::
                vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ::operator[](&module->memories,0);
      pMVar6 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->
                         (this_00);
      wasm::Name::operator=(&this->asyncifyMemory,(Name *)pMVar6);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7a0,"asyncify-memory",&local_7a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8,"memory",(allocator<char> *)((long)&__range4 + 7));
      Pass::getArgumentOrDefault((string *)local_780,&this->super_Pass,&local_7a0,&local_7c8);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      std::__cxx11::string::~string((string *)&local_7a0);
      std::allocator<char>::~allocator(&local_7a1);
      __end4 = std::
               vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ::begin(&module->exports);
      theExport = (unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *)
                  std::
                  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ::end(&module->exports);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                                         *)&theExport), bVar1) {
        local_7f0 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
                    ::operator*(&__end4);
        pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                           (local_7f0);
        local_14d1 = false;
        if (pEVar7->kind == Memory) {
          pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (local_7f0);
          IString::IString(&local_800,(string *)local_780);
          local_14d1 = IString::operator==((IString *)pEVar7,&local_800);
        }
        if (local_14d1 != false) {
          pEVar7 = std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>::operator->
                             (local_7f0);
          pNVar8 = Export::getInternalName(pEVar7);
          wasm::Name::operator=(&this->asyncifyMemory,pNVar8);
          break;
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_*,_std::vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>_>
        ::operator++(&__end4);
      }
      bVar1 = IString::operator_cast_to_bool(&(this->asyncifyMemory).super_IString);
      if (!bVar1) {
        Fatal::Fatal(&local_988);
        Fatal::operator<<(&local_988,
                          (char (*) [93])
                          "Please specify which of the multiple memories to use, with --pass-arg=asyncify-memory@memory"
                         );
        Fatal::~Fatal(&local_988);
      }
      std::__cxx11::string::~string((string *)local_780);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_710,"asyncify-secondary-memory-size",&local_711);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_738,"1",(allocator<char> *)((long)&secondaryMemorySize.addr + 7));
    Pass::getArgumentOrDefault((string *)local_6f0,&this->super_Pass,&local_710,&local_738);
    std::__cxx11::string::~string((string *)&local_738);
    std::allocator<char>::~allocator((allocator<char> *)((long)&secondaryMemorySize.addr + 7));
    std::__cxx11::string::~string((string *)&local_710);
    std::allocator<char>::~allocator(&local_711);
    iVar2 = std::__cxx11::stoi((string *)local_6f0,(size_t *)0x0,10);
    wasm::Address::Address(&local_748,(long)iVar2);
    asyncifyMemoryValue.field_2._8_8_ = local_748.addr;
    local_758 = (string_view)createSecondaryMemory(this,module,local_748);
    wasm::Name::operator=(&this->asyncifyMemory,(Name *)&local_758);
    std::__cxx11::string::~string((string *)local_6f0);
  }
  local_9a8 = (this->asyncifyMemory).super_IString.str._M_len;
  pcStack_9a0 = (this->asyncifyMemory).super_IString.str._M_str;
  this_01 = Module::getMemory(module,(Name)(this->asyncifyMemory).super_IString.str);
  bVar1 = Memory::is64(this_01);
  wasm::Type::Type(&local_990,bVar1 | i32);
  (this->pointerType).id = local_990.id;
  String::Split::Split(&local_9e8,(Split *)local_2e0);
  String::handleBracketingOperators(&local_9c8,&local_9e8);
  String::Split::operator=((Split *)local_2e0,&local_9c8);
  String::Split::~Split(&local_9c8);
  String::Split::~Split(&local_9e8);
  String::Split::Split(&local_a28,(Split *)local_388);
  String::handleBracketingOperators(&local_a08,&local_a28);
  String::Split::operator=((Split *)local_388,&local_a08);
  String::Split::~Split(&local_a08);
  String::Split::~Split(&local_a28);
  String::Split::Split(&local_a68,(Split *)local_580);
  String::handleBracketingOperators(&local_a48,&local_a68);
  String::Split::operator=((Split *)local_580,&local_a48);
  String::Split::~Split(&local_a48);
  String::Split::~Split(&local_a68);
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_580);
  if (bVar1) {
LAB_01aca146:
    analyzer._184_8_ = &listedImports.field_0x1e;
    canImportChangeState.allImportsCanChangeState = (bool *)local_170;
    canImportChangeState_00 = &instrumentedFuncs._M_h._M_single_bucket;
    std::function<bool(wasm::Name,wasm::Name)>::
    function<wasm::Asyncify::run(wasm::Module*)::_lambda(wasm::Name,wasm::Name)_1_&,void>
              ((function<bool(wasm::Name,wasm::Name)> *)canImportChangeState_00,
               (anon_class_16_2_6eb1be3e *)&analyzer.verbose);
    anon_unknown_0::ModuleAnalyzer::ModuleAnalyzer
              ((ModuleAnalyzer *)local_cc0,module,
               (function<bool_(wasm::Name,_wasm::Name)> *)canImportChangeState_00,
               (bool)(local_1b2 & 1),(Split *)local_2e0,(Split *)local_388,(bool)(local_6a2 & 1),
               (Split *)local_580,(bool)(local_62a & 1));
    std::function<bool_(wasm::Name,_wasm::Name)>::~function
              ((function<bool_(wasm::Name,_wasm::Name)> *)&instrumentedFuncs._M_h._M_single_bucket);
    addGlobals(this,module,(bool)(local_652 & 1));
    std::
    unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
    ::unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                     *)&__range2);
    __end2 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(&module->functions);
    func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
           std::
           vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ::end(&module->functions);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                                  *)&func);
      if (!bVar1) break;
      local_d38 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                  ::operator*(&__end2);
      func_00 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                          (local_d38);
      bVar1 = anon_unknown_0::ModuleAnalyzer::needsInstrumentation
                        ((ModuleAnalyzer *)local_cc0,func_00);
      if (bVar1) {
        local_d40 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::get
                              (local_d38);
        pVar9 = std::
                unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                ::insert((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                          *)&__range2,&local_d40);
        runner.relevantFuncs =
             (FuncSet *)pVar9.first.super__Node_iterator_base<wasm::Function_*,_false>._M_cur;
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
      ::operator++(&__end2);
    }
    PassUtils::FilteredPassRunner::FilteredPassRunner
              ((FilteredPassRunner *)local_e48,module,(FuncSet *)&__range2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"flatten",&local_e69);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_e48,&local_e68,&local_e98);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_e98);
    std::__cxx11::string::~string((string *)&local_e68);
    std::allocator<char>::~allocator(&local_e69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ec0,"dce",&local_ec1);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::optional();
    PassRunner::add((PassRunner *)local_e48,&local_ec0,&local_ef0);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~optional(&local_ef0);
    std::__cxx11::string::~string((string *)&local_ec0);
    std::allocator<char>::~allocator(&local_ec1);
    if ((stateChangingImports.field_2._M_local_buf[0xf] & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f18,"remove-unused-names",&local_f19);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_f18,&local_f48);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_f48);
      std::__cxx11::string::~string((string *)&local_f18);
      std::allocator<char>::~allocator(&local_f19);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f70,"simplify-locals-nonesting",&local_f71);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_f70,&local_fa0);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_fa0);
      std::__cxx11::string::~string((string *)&local_f70);
      std::allocator<char>::~allocator(&local_f71);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_fc8,"reorder-locals",&local_fc9);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_fc8,&local_ff8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_ff8);
      std::__cxx11::string::~string((string *)&local_fc8);
      std::allocator<char>::~allocator(&local_fc9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1020,"coalesce-locals",&local_1021);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_1020,&local_1050);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1050);
      std::__cxx11::string::~string((string *)&local_1020);
      std::allocator<char>::~allocator(&local_1021);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1078,"simplify-locals-nonesting",&local_1079);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_1078,&local_10a8);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_10a8);
      std::__cxx11::string::~string((string *)&local_1078);
      std::allocator<char>::~allocator(&local_1079);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_10d0,"reorder-locals",&local_10d1);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_10d0,&local_1100);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1100);
      std::__cxx11::string::~string((string *)&local_10d0);
      std::allocator<char>::~allocator(&local_10d1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1128,"merge-blocks",&local_1129);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional();
      PassRunner::add((PassRunner *)local_e48,&local_1128,&local_1158);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_1158);
      std::__cxx11::string::~string((string *)&local_1128);
      std::allocator<char>::~allocator(&local_1129);
    }
    runner_1._232_8_ = local_cc0;
    std::
    make_unique<wasm::(anonymous_namespace)::AsyncifyFlow,wasm::(anonymous_namespace)::ModuleAnalyzer*,wasm::Type&,wasm::Name&>
              ((ModuleAnalyzer **)&local_1170,(Type *)&runner_1.isNested,(Name *)&this->pointerType)
    ;
    std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyFlow,std::default_delete<wasm::(anonymous_namespace)::AsyncifyFlow>,void>
              ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)local_1168,&local_1170);
    PassRunner::add((PassRunner *)local_e48,local_1168);
    std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(local_1168);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyFlow,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyFlow>_>
    ::~unique_ptr(&local_1170);
    PassRunner::setIsNested((PassRunner *)local_e48,true);
    PassRunner::setValidateGlobally((PassRunner *)local_e48,false);
    PassRunner::run((PassRunner *)local_e48);
    PassUtils::FilteredPassRunner::~FilteredPassRunner((FilteredPassRunner *)local_e48);
    if ((local_602 & 1) != 0) {
      PassRunner::PassRunner((PassRunner *)local_1268,module);
      runner_2.relevantFuncs = (FuncSet *)local_cc0;
      std::
      make_unique<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented,wasm::(anonymous_namespace)::ModuleAnalyzer*,wasm::Type&,wasm::Name&>
                ((ModuleAnalyzer **)&local_1278,(Type *)&runner_2.relevantFuncs,
                 (Name *)&this->pointerType);
      std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
      unique_ptr<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented,std::default_delete<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented>,void>
                ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_1270,&local_1278);
      PassRunner::add((PassRunner *)local_1268,&local_1270);
      std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_1270);
      std::
      unique_ptr<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyAssertInNonInstrumented>_>
      ::~unique_ptr(&local_1278);
      PassRunner::setIsNested((PassRunner *)local_1268,true);
      PassRunner::setValidateGlobally((PassRunner *)local_1268,false);
      PassRunner::run((PassRunner *)local_1268);
      PassRunner::~PassRunner((PassRunner *)local_1268);
    }
    PassUtils::FilteredPassRunner::FilteredPassRunner
              ((FilteredPassRunner *)local_1378,module,(FuncSet *)&__range2);
    if ((stateChangingImports.field_2._M_local_buf[0xf] & 1U) != 0) {
      PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)local_1378);
    }
    local_1390.id = (uintptr_t)local_cc0;
    std::
    make_unique<wasm::(anonymous_namespace)::AsyncifyLocals,wasm::(anonymous_namespace)::ModuleAnalyzer*,wasm::Type&,wasm::Name&>
              ((ModuleAnalyzer **)&local_1388,&local_1390,(Name *)&this->pointerType);
    std::unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>>::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyLocals,std::default_delete<wasm::(anonymous_namespace)::AsyncifyLocals>,void>
              ((unique_ptr<wasm::Pass,std::default_delete<wasm::Pass>> *)&local_1380,&local_1388);
    PassRunner::add((PassRunner *)local_1378,&local_1380);
    std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_1380);
    std::
    unique_ptr<wasm::(anonymous_namespace)::AsyncifyLocals,_std::default_delete<wasm::(anonymous_namespace)::AsyncifyLocals>_>
    ::~unique_ptr(&local_1388);
    if ((stateChangingImports.field_2._M_local_buf[0xf] & 1U) != 0) {
      PassRunner::addDefaultFunctionOptimizationPasses((PassRunner *)local_1378);
    }
    PassRunner::setIsNested((PassRunner *)local_1378,true);
    PassRunner::setValidateGlobally((PassRunner *)local_1378,false);
    PassRunner::run((PassRunner *)local_1378);
    PassUtils::FilteredPassRunner::~FilteredPassRunner((FilteredPassRunner *)local_1378);
    addFunctions(this,module);
    std::
    unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
    ::~unordered_set((unordered_set<wasm::Function_*,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<wasm::Function_*>_>
                      *)&__range2);
    anon_unknown_0::ModuleAnalyzer::~ModuleAnalyzer((ModuleAnalyzer *)local_cc0);
    String::Split::~Split((Split *)local_580);
    std::__cxx11::string::~string((string *)local_4a0);
    String::Split::~Split((Split *)local_388);
    String::Split::~Split((Split *)local_2e0);
    std::__cxx11::string::~string((string *)local_200);
    String::Split::~Split((Split *)local_170);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  bVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2e0);
  if (bVar1) {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_388);
    if (bVar1) goto LAB_01aca146;
  }
  Fatal::Fatal((Fatal *)&canImportChangeState.listedImports);
  Fatal::operator<<((Fatal *)&canImportChangeState.listedImports,
                    (char (*) [80])
                    "It makes no sense to use both an asyncify only-list together with another list."
                   );
  Fatal::~Fatal((Fatal *)&canImportChangeState.listedImports);
}

Assistant:

void run(Module* module) override {
    bool optimize = getPassOptions().optimizeLevel > 0;

    // Find which things can change the state.
    auto stateChangingImports = String::trim(read_possible_response_file(
      getArgumentOrDefault("asyncify-imports", "")));
    auto ignoreImports = getArgumentOrDefault("asyncify-ignore-imports", "");
    bool allImportsCanChangeState =
      stateChangingImports == "" && ignoreImports == "";
    String::Split listedImports(stateChangingImports,
                                String::Split::NewLineOr(","));
    // canIndirectChangeState is the default.  asyncify-ignore-indirect sets it
    // to false.
    auto canIndirectChangeState = !hasArgument("asyncify-ignore-indirect");
    std::string removeListInput =
      getArgumentOrDefault("asyncify-removelist", "");
    if (removeListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      removeListInput = getArgumentOrDefault("asyncify-blacklist", "");
    }
    String::Split removeList(
      String::trim(read_possible_response_file(removeListInput)),
      String::Split::NewLineOr(","));
    String::Split addList(String::trim(read_possible_response_file(
                            getArgumentOrDefault("asyncify-addlist", ""))),
                          String::Split::NewLineOr(","));
    std::string onlyListInput = getArgumentOrDefault("asyncify-onlylist", "");
    if (onlyListInput.empty()) {
      // Support old name for now to avoid immediate breakage TODO remove
      onlyListInput = getArgumentOrDefault("asyncify-whitelist", "");
    }
    String::Split onlyList(
      String::trim(read_possible_response_file(onlyListInput)),
      String::Split::NewLineOr(","));
    auto asserts = hasArgument("asyncify-asserts");
    auto verbose = hasArgument("asyncify-verbose");
    auto relocatable = hasArgument("asyncify-relocatable");
    auto secondaryMemory = hasArgument("asyncify-in-secondary-memory");
    auto propagateAddList = hasArgument("asyncify-propagate-addlist");

    // Ensure there is a memory, as we need it.

    if (secondaryMemory) {
      auto secondaryMemorySizeString =
        getArgumentOrDefault("asyncify-secondary-memory-size", "1");
      Address secondaryMemorySize = std::stoi(secondaryMemorySizeString);
      asyncifyMemory = createSecondaryMemory(module, secondaryMemorySize);
    } else {
      if (module->memories.size() <= 1) {
        MemoryUtils::ensureExists(module);
        asyncifyMemory = module->memories[0]->name;
      } else {
        auto asyncifyMemoryValue =
          getArgumentOrDefault("asyncify-memory", "memory");
        for (auto& theExport : module->exports) {
          if (theExport->kind == ExternalKind::Memory &&
              theExport->name == asyncifyMemoryValue) {
            asyncifyMemory = *theExport->getInternalName();
            break;
          }
        }
        if (!asyncifyMemory) {
          Fatal() << "Please specify which of the multiple memories to use, "
                     "with --pass-arg=asyncify-memory@memory";
        }
      }
    }
    pointerType =
      module->getMemory(asyncifyMemory)->is64() ? Type::i64 : Type::i32;

    removeList = handleBracketingOperators(removeList);
    addList = handleBracketingOperators(addList);
    onlyList = handleBracketingOperators(onlyList);

    if (!onlyList.empty() && (!removeList.empty() || !addList.empty())) {
      Fatal() << "It makes no sense to use both an asyncify only-list together "
                 "with another list.";
    }

    auto canImportChangeState = [&](Name module, Name base) {
      if (allImportsCanChangeState) {
        return true;
      }
      auto full = getFullImportName(module, base);
      for (auto& listedImport : listedImports) {
        if (String::wildcardMatch(listedImport, full)) {
          return true;
        }
      }
      return false;
    };

    // Scan the module.
    ModuleAnalyzer analyzer(*module,
                            canImportChangeState,
                            canIndirectChangeState,
                            removeList,
                            addList,
                            propagateAddList,
                            onlyList,
                            verbose);

    // Add necessary globals before we emit code to use them.
    addGlobals(module, relocatable);

    // Compute the set of functions we will instrument. All of the passes we run
    // below only need to run there.
    PassUtils::FuncSet instrumentedFuncs;
    for (auto& func : module->functions) {
      if (analyzer.needsInstrumentation(func.get())) {
        instrumentedFuncs.insert(func.get());
      }
    }

    // Instrument the flow of code, adding code instrumentation and
    // skips for when rewinding. We do this on flat IR so that it is
    // practical to add code around each call, without affecting
    // anything else.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      runner.add("flatten");
      // Dce is useful here, since AsyncifyFlow makes control flow conditional,
      // which may make unreachable code look reachable. It also lets us ignore
      // unreachable code here.
      runner.add("dce");
      if (optimize) {
        // Optimizing before AsyncifyFlow is crucial, especially coalescing,
        // because the flow changes add many branches, break up if-elses, etc.,
        // all of which extend the live ranges of locals. In other words, it is
        // not possible to coalesce well afterwards.
        runner.add("remove-unused-names");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("coalesce-locals");
        runner.add("simplify-locals-nonesting");
        runner.add("reorder-locals");
        runner.add("merge-blocks");
      }
      runner.add(
        std::make_unique<AsyncifyFlow>(&analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    if (asserts) {
      // Add asserts in non-instrumented code. Note we do not use an
      // instrumented pass runner here as we do want to run on all functions.
      PassRunner runner(module);
      runner.add(std::make_unique<AsyncifyAssertInNonInstrumented>(
        &analyzer, pointerType, asyncifyMemory));
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Next, add local saving/restoring logic. We optimize before doing this,
    // to undo the extra code generated by flattening, and to arrive at the
    // minimal amount of locals (which is important as we must save and
    // restore those locals). We also and optimize after as well to simplify
    // the code as much as possible.
    {
      PassUtils::FilteredPassRunner runner(module, instrumentedFuncs);
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.add(std::make_unique<AsyncifyLocals>(
        &analyzer, pointerType, asyncifyMemory));
      if (optimize) {
        runner.addDefaultFunctionOptimizationPasses();
      }
      runner.setIsNested(true);
      runner.setValidateGlobally(false);
      runner.run();
    }
    // Finally, add function support (that should not have been seen by
    // the previous passes).
    addFunctions(module);
  }